

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O2

double runWBICMetropolis(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *frequencyMatrix,
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *docVoca,vector<double,_std::allocator<double>_> *alpha,
                        vector<double,_std::allocator<double>_> *beta,uint n)

{
  int d;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int v;
  ulong uVar8;
  double dVar9;
  double dVar10;
  result_type rVar11;
  int local_2990;
  double local_2988;
  uint K;
  uint D;
  double local_2970;
  __type local_2968;
  double local_2960;
  double local_2958;
  ulong local_2950;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_2948;
  vector<double,_std::allocator<double>_> *local_2940;
  __type local_2938;
  vector<double,_std::allocator<double>_> *local_2930;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_2928;
  double local_2920;
  double local_2918;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  thetaCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phi;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  theta;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrix;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrix;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  betaMatrixUniform;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  alphaMatrixUniform;
  _Vector_base<double,_std::allocator<double>_> local_2828;
  _Vector_base<double,_std::allocator<double>_> local_2810;
  uniform_real_distribution<double> local_27f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_27e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_27d0;
  _Vector_base<double,_std::allocator<double>_> local_27b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  phiCandidate;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2788;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2770;
  _Vector_base<double,_std::allocator<double>_> local_2758;
  random_device rnd;
  mt19937 mt;
  
  uVar2 = ((long)(docVoca->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(docVoca->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  D = (uint)uVar2;
  uVar8 = (ulong)((long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(alpha->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar3 = (ulong)((long)(beta->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(beta->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  local_2990 = (int)uVar3;
  if (n == 0) {
    n = 0;
    for (uVar5 = 0; uVar5 != (uVar2 & 0xffffffff); uVar5 = uVar5 + 1) {
      for (uVar6 = 0; (uVar3 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
        n = n + *(int *)(*(long *)&(frequencyMatrix->
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + uVar6 * 4);
      }
    }
  }
  uVar6 = uVar2 & 0xffffffff;
  K = (uint)uVar8;
  local_2948 = frequencyMatrix;
  local_2928 = docVoca;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&alphaMatrix,uVar6,alpha,(allocator_type *)&rnd);
  uVar5 = uVar8 & 0xffffffff;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&betaMatrix,uVar5,beta,(allocator_type *)&rnd);
  local_2940 = alpha;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&alphaMatrixCandidate,uVar6,alpha,(allocator_type *)&rnd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&betaMatrixCandidate,uVar5,beta,(allocator_type *)&rnd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&alphaMatrixUniform,uVar6,local_2940,(allocator_type *)&rnd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&betaMatrixUniform,uVar5,beta,(allocator_type *)&rnd);
  uVar2 = uVar2 & 0xffffffff;
  for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    for (uVar6 = 0; (uVar8 & 0xffffffff) != uVar6; uVar6 = uVar6 + 1) {
      alphaMatrixUniform.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar6] = 1.0;
    }
  }
  uVar6 = uVar8 & 0xffffffff;
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0; (uVar3 & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
      betaMatrixUniform.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar5].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar7] = 1.0;
    }
  }
  local_2930 = beta;
  samplingParamFromDirichlet(&theta,&alphaMatrixUniform,&D);
  samplingParamFromDirichlet(&phi,&betaMatrixUniform,&K);
  local_2958 = calculateLogLikelihood(&theta,&phi,local_2948,local_2928);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_2810,local_2940);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_2828,local_2930);
  local_2960 = calculateLogPriorDistributionValue
                         (&theta,&phi,(vector<double,_std::allocator<double>_> *)&local_2810,
                          (vector<double,_std::allocator<double>_> *)&local_2828);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2828);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2810);
  local_2968 = std::log<unsigned_int>(n);
  std::random_device::random_device(&rnd);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar1);
  local_2920 = (1.0 / local_2968) * local_2958 + local_2960;
  local_27f8._M_param._M_a = 0.0;
  local_27f8._M_param._M_b = 1.0;
  local_2960 = (double)((uint)uVar8 * 999);
  for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      alphaMatrix.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar8].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = theta.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar5] * local_2960 + 1.0;
    }
  }
  local_2968 = (__type)(uint)(local_2990 * 999);
  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    for (uVar5 = 0; (uVar3 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
      betaMatrix.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar8].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = phi.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar5] * local_2968 + 1.0;
    }
  }
  local_2988 = 0.0;
  local_2950 = 0;
  for (uVar1 = 0; uVar1 != 60000; uVar1 = uVar1 + 1) {
    samplingParamFromDirichlet(&thetaCandidate,&alphaMatrix,&D);
    samplingParamFromDirichlet(&phiCandidate,&betaMatrix,&K);
    for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
      for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        alphaMatrixCandidate.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar5] = thetaCandidate.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5] * local_2960 + 1.0;
      }
    }
    for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
      for (uVar5 = 0; (uVar3 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
        betaMatrixCandidate.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar8].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar5] = phiCandidate.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5] * local_2968 + 1.0;
      }
    }
    local_2918 = calculateLogLikelihood(&thetaCandidate,&phiCandidate,local_2948,local_2928);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_27b8,local_2940);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_2758,local_2930);
    local_2970 = calculateLogPriorDistributionValue
                           (&thetaCandidate,&phiCandidate,
                            (vector<double,_std::allocator<double>_> *)&local_27b8,
                            (vector<double,_std::allocator<double>_> *)&local_2758);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_2758);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_27b8);
    local_2938 = std::log<unsigned_int>(n);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_27d0,&alphaMatrix);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2770,&betaMatrix);
    dVar9 = calculateLogProposalDistributionValue
                      (&thetaCandidate,&phiCandidate,&local_27d0,&local_2770);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2770);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_27d0);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_27e8,&alphaMatrixCandidate);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_2788,&betaMatrixCandidate);
    dVar10 = calculateLogProposalDistributionValue(&theta,&phi,&local_27e8,&local_2788);
    local_2970 = (1.0 / local_2938) * local_2918 + local_2970;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2788);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_27e8);
    local_2938 = exp(((local_2970 - local_2920) + dVar10) - dVar9);
    rVar11 = std::uniform_real_distribution<double>::operator()(&local_27f8,&mt);
    if (rVar11 < local_2938) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&theta,&thetaCandidate);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&phi,&phiCandidate);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&alphaMatrix,&alphaMatrixCandidate);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(&betaMatrix,&betaMatrixCandidate);
      local_2950 = (ulong)((int)local_2950 + 1);
      local_2958 = local_2918;
      local_2920 = local_2970;
    }
    if ((49999 < uVar1) && ((uVar1 - 49999) % 100 == 0)) {
      local_2988 = local_2988 + local_2958;
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&phiCandidate);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&thetaCandidate);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"acceptanceTimes: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::random_device::~random_device(&rnd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&phi);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&theta);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&betaMatrixUniform);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&alphaMatrixUniform);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&betaMatrixCandidate);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&alphaMatrixCandidate);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&betaMatrix);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&alphaMatrix);
  return local_2988 / 100.0;
}

Assistant:

double runWBICMetropolis(const vector<vector<unsigned int> > &frequencyMatrix, const vector<vector<unsigned int> > &docVoca, const vector<double> &alpha, const vector<double> &beta, unsigned int n){
    unsigned int D = docVoca.size(), K = alpha.size(), V = beta.size();
    if(n==0){
        for(int d=0; d<D; d++){
            for(int v=0; v<V; v++){
                n += frequencyMatrix[d][v];
            }
        }
    }
    vector<vector<double> > alphaMatrix(D, alpha);
    vector<vector<double> > betaMatrix(K, beta);
    vector<vector<double> > alphaMatrixCandidate(D, alpha);
    vector<vector<double> > betaMatrixCandidate(K, beta);
    vector<vector<double> > alphaMatrixUniform(D, alpha);
    vector<vector<double> > betaMatrixUniform(K, beta);
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrixUniform[d][k] = 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrixUniform[k][v] = 1;
        }
    }
    unsigned int iteration = 60000;
    unsigned int burnIn = 50000;
    unsigned int samplingInterval = 100;
    const unsigned int RATE = 1000;
    unsigned int samplingTimes = (iteration - burnIn) / samplingInterval;
    unsigned int acceptanceTimes = 0;
    double logLikelihoodAverage = 0.0;
    vector<vector<double> > theta = samplingParamFromDirichlet(alphaMatrixUniform, D);
    vector<vector<double> > phi = samplingParamFromDirichlet(betaMatrixUniform, K);
    double logLikelihood = calculateLogLikelihood(theta, phi, frequencyMatrix, docVoca);
    double logPriorDistributionValue = calculateLogPriorDistributionValue(theta, phi, alpha, beta);
    double logTargetDistributionValue = calculateLogTargetDistributionValue(logLikelihood, logPriorDistributionValue, n);
    // double logTargetDistributionValue = 0;
    random_device rnd;
    mt19937 mt(rnd());
    uniform_real_distribution<double> randN(0,1);
    const unsigned int alphaSum = RATE * K;
    const unsigned int betaSum = RATE * V;
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            alphaMatrix[d][k] = theta[d][k] * (alphaSum - K) + 1;
        }
    }
    for(int k=0; k<K; k++){
        for(int v=0; v<V; v++){
            betaMatrix[k][v] = phi[k][v] * (betaSum - V) + 1;
        }
    }
    for(int i=0; i<iteration; i++){
        vector<vector<double> > thetaCandidate = samplingParamFromDirichlet(alphaMatrix, D);
        vector<vector<double> > phiCandidate = samplingParamFromDirichlet(betaMatrix, K);

        for(int d=0; d<D; d++){
            for(int k=0; k<K; k++){
                alphaMatrixCandidate[d][k] = thetaCandidate[d][k] * (alphaSum - K) + 1;
            }
        }
        for(int k=0; k<K; k++){
            for(int v=0; v<V; v++){
                betaMatrixCandidate[k][v] = phiCandidate[k][v] * (betaSum - V) + 1;
            }
        }
        double logLikelihoodCandidate = calculateLogLikelihood(thetaCandidate, phiCandidate, frequencyMatrix, docVoca);
        double logPriorDistributionValueCandidate = calculateLogPriorDistributionValue(thetaCandidate, phiCandidate, alpha, beta);
        double logTargetDistributionValueCandidate = calculateLogTargetDistributionValue(logLikelihoodCandidate, logPriorDistributionValueCandidate, n);
        double logProposalDistributionValueToCandidate = calculateLogProposalDistributionValue(thetaCandidate, phiCandidate, alphaMatrix, betaMatrix);
        double logProposalDistributionValueToSample = calculateLogProposalDistributionValue(theta, phi, alphaMatrixCandidate, betaMatrixCandidate);

        double acceptanceProb = exp(logTargetDistributionValueCandidate - logTargetDistributionValue + logProposalDistributionValueToSample - logProposalDistributionValueToCandidate);
        double randomValue = randN(mt);
        if(acceptanceProb > randomValue){
            acceptanceTimes += 1;
            theta = thetaCandidate;
            phi = phiCandidate;
            alphaMatrix = alphaMatrixCandidate;
            betaMatrix = betaMatrixCandidate;
            logLikelihood = logLikelihoodCandidate;
            logPriorDistributionValue = logPriorDistributionValueCandidate;
            logTargetDistributionValue = logTargetDistributionValueCandidate;
        }
        if((i > burnIn-1) && (i-burnIn+1)%samplingInterval == 0){
            logLikelihoodAverage += logLikelihood;
        }
    }
    logLikelihoodAverage /= samplingTimes;
    cout<<"acceptanceTimes: "<<acceptanceTimes<<endl;
    return logLikelihoodAverage;
}